

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# magic.c
# Opt level: O3

void spell_nether_breath(int sn,int level,CHAR_DATA *ch,void *vo,int target)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  AFFECT_DATA af;
  AFFECT_DATA AStack_98;
  
  act("$n opens $s mouth and unleashes a blast of pure darkness at you!",ch,(void *)0x0,vo,2);
  act("$n opens $s mouth and unleashes a blast of pure darkness at $N!",ch,(void *)0x0,vo,1);
  uVar1 = ch->hit / 10;
  uVar3 = 100;
  if (100 < (int)uVar1) {
    uVar3 = uVar1;
  }
  bVar2 = saves_spell(level,(CHAR_DATA *)vo,9);
  damage_old(ch,(CHAR_DATA *)vo,uVar3 >> bVar2,sn,9,true);
  if (!bVar2) {
    bVar2 = is_affected((CHAR_DATA *)vo,(int)gsn_curse);
    if (!bVar2) {
      init_affect(&AStack_98);
      AStack_98.where = 0;
      AStack_98.type = gsn_curse;
      AStack_98.aftype = 0;
      AStack_98.modifier = (short)(level / 3);
      AStack_98.duration = 0xc;
      AStack_98.location = 0x14;
      AStack_98.bitvector[0]._1_1_ = AStack_98.bitvector[0]._1_1_ | 4;
      AStack_98.owner = ch;
      AStack_98.level = (short)level;
      affect_to_char((CHAR_DATA *)vo,&AStack_98);
      send_to_char("You feel unclean.\n\r",(CHAR_DATA *)vo);
      act("$n looks very uncomfortable.",(CHAR_DATA *)vo,(void *)0x0,(void *)0x0,0);
    }
  }
  return;
}

Assistant:

void spell_nether_breath(int sn, int level, CHAR_DATA *ch, void *vo, int target)
{
	CHAR_DATA *victim = (CHAR_DATA *)vo;
	AFFECT_DATA af;
	int dam;
	bool saved = true;

	act("$n opens $s mouth and unleashes a blast of pure darkness at you!", ch, 0, victim, TO_VICT);
	act("$n opens $s mouth and unleashes a blast of pure darkness at $N!", ch, 0, victim, TO_NOTVICT);

	dam = std::max(100, ch->hit / 10);

	if (saves_spell(level, victim, DAM_NEGATIVE))
		dam /= 2;
	else
		saved = false;

	damage_old(ch, victim, dam, sn, DAM_NEGATIVE, true);

	if (!saved && !is_affected(victim, gsn_curse))
	{
		init_affect(&af);
		af.where = TO_AFFECTS;
		af.type = gsn_curse;
		af.aftype = AFT_SPELL;
		af.location = APPLY_SAVES;
		af.modifier = level / 3;
		af.duration = 12;
		af.level = level;
		af.owner = ch;

		SET_BIT(af.bitvector, AFF_CURSE);

		affect_to_char(victim, &af);

		send_to_char("You feel unclean.\n\r", victim);
		act("$n looks very uncomfortable.", victim, 0, 0, TO_ROOM);
	}
}